

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

void voc_make_obj_name(voccxdef *ctx,char *namebuf,char **cmd,int firstwrd,int lastwrd)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar2 = (int)cmd;
  *namebuf = '\0';
  iVar4 = lastwrd - firstwrd;
  if (iVar4 != 0 && firstwrd <= lastwrd) {
    lVar6 = (long)firstwrd;
    do {
      lVar5 = lVar6 + 1;
      pcVar1 = cmd[lVar6];
      iVar2 = voc_check_special(ctx,pcVar1,iVar2);
      if (iVar2 == 0) {
        strcat(namebuf,pcVar1);
      }
      else {
        vocaddof(ctx,namebuf);
      }
      pcVar1 = cmd[lVar6];
      sVar3 = strlen(pcVar1);
      iVar2 = extraout_EDX;
      if (lVar5 < lastwrd && pcVar1[sVar3 - 1] == '.') {
        sVar3 = strlen(namebuf);
        (namebuf + sVar3)[0] = '\\';
        (namebuf + sVar3)[1] = '\0';
        iVar2 = extraout_EDX_00;
      }
      if (lVar5 < lastwrd) {
        sVar3 = strlen(namebuf);
        (namebuf + sVar3)[0] = ' ';
        (namebuf + sVar3)[1] = '\0';
        iVar2 = extraout_EDX_01;
      }
      iVar4 = iVar4 + -1;
      lVar6 = lVar5;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

void voc_make_obj_name(voccxdef *ctx, char *namebuf, char *cmd[],
                       int firstwrd, int lastwrd)
{
    int i;
    
    /* run through the range of words, and add them to the buffer */
    for (i = firstwrd, namebuf[0] = '\0' ; i < lastwrd ; ++i)
    {
        if (voc_check_special(ctx, cmd[i], VOCW_OF))
            vocaddof(ctx, namebuf);
        else
            strcat(namebuf, cmd[i]);
        
        if (cmd[i][strlen(cmd[i])-1] == '.' && i + 1 < lastwrd)
            strcat(namebuf, "\\");

        if (i + 1 < lastwrd)
            strcat(namebuf, " ");
    }
}